

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void standard_text_validate(standard_display *dp,png_const_structp pp,png_infop pi,int check_end)

{
  uint uVar1;
  png_textp tp;
  char msg [64];
  png_const_textp local_60;
  char local_58 [72];
  
  local_60 = (png_const_textp)0x0;
  uVar1 = png_get_text(pp,pi,&local_60,0);
  if ((uVar1 == 2) && (local_60 != (png_const_textp)0x0)) {
    standard_check_text(pp,local_60,"image name",dp->ps->current->name);
    standard_check_text(pp,local_60 + 1,"end marker","end");
    return;
  }
  sprintf(local_58,"expected two text items, got %lu",(ulong)uVar1);
  png_error(pp,local_58);
}

Assistant:

static void
standard_text_validate(standard_display *dp, png_const_structp pp,
   png_infop pi, int check_end)
{
   png_textp tp = NULL;
   png_uint_32 num_text = png_get_text(pp, pi, &tp, NULL);

   if (num_text == 2 && tp != NULL)
   {
      standard_check_text(pp, tp, "image name", dp->ps->current->name);

      /* This exists because prior to 1.5.18 the progressive reader left the
       * png_struct z_stream unreset at the end of the image, so subsequent
       * attempts to use it simply returns Z_STREAM_END.
       */
      if (check_end)
         standard_check_text(pp, tp+1, "end marker", "end");
   }

   else
   {
      char msg[64];

      sprintf(msg, "expected two text items, got %lu",
         (unsigned long)num_text);
      png_error(pp, msg);
   }
}